

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::
ElementsAreMatcherImpl<google::protobuf::Map<unsigned_int,proto2_unittest::Proto2MapEnumPlusExtra>const&>
::
ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>*,std::vector<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>,std::allocator<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>>>>>
          (ElementsAreMatcherImpl<google::protobuf::Map<unsigned_int,proto2_unittest::Proto2MapEnumPlusExtra>const&>
           *this,__normal_iterator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>_>
                 first,
          __normal_iterator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_*,_std::vector<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>,_std::allocator<testing::Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>_>_>_>
          last)

{
  MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
  local_40;
  
  *(undefined ***)this = &PTR__ElementsAreMatcherImpl_018a6d90;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  if (first._M_current != last._M_current) {
    do {
      local_40.vtable_ =
           ((first._M_current)->
           super_MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
           ).vtable_;
      local_40.buffer_ =
           (Buffer)((first._M_current)->
                   super_MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                   ).buffer_.shared;
      if ((local_40.vtable_ != (VTable *)0x0) &&
         ((local_40.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
        LOCK();
        ((local_40.buffer_.shared)->ref).super___atomic_base<int>._M_i =
             ((local_40.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_40.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherBase_018a6c68;
      std::
      vector<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>,std::allocator<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>>>
      ::
      emplace_back<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>>
                ((vector<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>,std::allocator<testing::Matcher<std::pair<unsigned_int_const,proto2_unittest::Proto2MapEnumPlusExtra>const&>>>
                  *)(this + 8),
                 (Matcher<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>
                  *)&local_40);
      first._M_current = first._M_current + 1;
      MatcherBase<const_std::pair<const_unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra>_&>::
      ~MatcherBase(&local_40);
    } while (first._M_current != last._M_current);
  }
  return;
}

Assistant:

ElementsAreMatcherImpl(InputIter first, InputIter last) {
    while (first != last) {
      matchers_.push_back(MatcherCast<const Element&>(*first++));
    }
  }